

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.cpp
# Opt level: O0

unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_> parse(string *module)

{
  pointer pMVar1;
  char *pcVar2;
  type pMVar3;
  Element *pEVar4;
  ParseException *p;
  SExpressionWasmBuilder builder;
  Element *root;
  SExpressionParser parser;
  uint local_38;
  FeatureSet local_20;
  undefined1 local_19;
  string *module_local;
  __single_object *wasm;
  
  local_19 = 0;
  module_local = module;
  std::make_unique<wasm::Module>();
  ::wasm::FeatureSet::FeatureSet(&local_20,0x1efff);
  pMVar1 = std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::operator->
                     ((unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_> *)module);
  (pMVar1->features).features = local_20.features;
  pcVar2 = (char *)std::__cxx11::string::front();
  ::wasm::SExpressionParser::SExpressionParser((SExpressionParser *)&root,pcVar2);
  pMVar3 = std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::operator*
                     ((unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_> *)module);
  pEVar4 = (Element *)::wasm::Element::operator[](local_38);
  ::wasm::SExpressionWasmBuilder::SExpressionWasmBuilder
            ((SExpressionWasmBuilder *)&p,pMVar3,pEVar4,Normal);
  ::wasm::SExpressionWasmBuilder::~SExpressionWasmBuilder((SExpressionWasmBuilder *)&p);
  ::wasm::SExpressionParser::~SExpressionParser((SExpressionParser *)&root);
  return (__uniq_ptr_data<wasm::Module,_std::default_delete<wasm::Module>,_true,_true>)
         (__uniq_ptr_data<wasm::Module,_std::default_delete<wasm::Module>,_true,_true>)module;
}

Assistant:

static std::unique_ptr<Module> parse(std::string module) {
  auto wasm = std::make_unique<Module>();
  wasm->features = FeatureSet::All;
  try {
    SExpressionParser parser(&module.front());
    Element& root = *parser.root;
    SExpressionWasmBuilder builder(*wasm, *root[0], IRProfile::Normal);
  } catch (ParseException& p) {
    p.dump(std::cerr);
    Fatal() << "error in parsing wasm text";
  }
  return wasm;
}